

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRboStateQueryTests.cpp
# Opt level: O0

void deqp::gles2::Functional::anon_unknown_1::checkRenderbufferParam
               (TestContext *testCtx,CallLogWrapper *gl,GLenum pname,GLenum reference)

{
  int pname_00;
  bool bVar1;
  int *piVar2;
  undefined1 local_2c [8];
  StateQueryMemoryWriteGuard<int> state;
  GLenum reference_local;
  GLenum pname_local;
  CallLogWrapper *gl_local;
  TestContext *testCtx_local;
  
  state.m_value = reference;
  state.m_postguard = pname;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_2c);
  pname_00 = state.m_postguard;
  piVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_2c);
  glu::CallLogWrapper::glGetRenderbufferParameteriv(gl,0x8d41,pname_00,piVar2);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_2c,testCtx);
  if (bVar1) {
    piVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_2c);
    checkIntEquals(testCtx,*piVar2,state.m_value);
  }
  return;
}

Assistant:

void checkRenderbufferParam (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLenum pname, GLenum reference)
{
	StateQueryMemoryWriteGuard<GLint> state;
	gl.glGetRenderbufferParameteriv(GL_RENDERBUFFER, pname, &state);

	if (state.verifyValidity(testCtx))
		checkIntEquals(testCtx, state, reference);
}